

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3IndexAffinityStr(sqlite3 *db,Index *pIdx)

{
  short sVar1;
  Table *pTVar2;
  char cVar3;
  char *pcVar4;
  char cVar5;
  long lVar6;
  ulong uVar7;
  
  if (pIdx->zColAff != (char *)0x0) {
    return pIdx->zColAff;
  }
  pTVar2 = pIdx->pTable;
  pcVar4 = (char *)sqlite3Malloc((ulong)pIdx->nColumn + 1);
  pIdx->zColAff = pcVar4;
  if (pcVar4 == (char *)0x0) {
    if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
      db->mallocFailed = '\x01';
      if (0 < db->nVdbeExec) {
        (db->u1).isInterrupted = 1;
      }
      (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    }
    pcVar4 = (char *)0x0;
  }
  else {
    if (pIdx->nColumn == 0) {
      uVar7 = 0;
    }
    else {
      lVar6 = 4;
      uVar7 = 0;
      do {
        sVar1 = pIdx->aiColumn[uVar7];
        if ((long)sVar1 < 0) {
          if (sVar1 == -1) {
            cVar5 = 'D';
          }
          else {
            cVar3 = sqlite3ExprAffinity(*(Expr **)((long)pIdx->aColExpr->a + lVar6 * 2 + -8));
            cVar5 = 'A';
            if (cVar3 != '\0') {
              cVar5 = cVar3;
            }
          }
        }
        else {
          cVar5 = pTVar2->aCol[sVar1].affinity;
        }
        pIdx->zColAff[uVar7] = cVar5;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < pIdx->nColumn);
      pcVar4 = pIdx->zColAff;
    }
    pcVar4[uVar7] = '\0';
    pcVar4 = pIdx->zColAff;
  }
  return pcVar4;
}

Assistant:

SQLITE_PRIVATE const char *sqlite3IndexAffinityStr(sqlite3 *db, Index *pIdx){
  if( !pIdx->zColAff ){
    /* The first time a column affinity string for a particular index is
    ** required, it is allocated and populated here. It is then stored as
    ** a member of the Index structure for subsequent use.
    **
    ** The column affinity string will eventually be deleted by
    ** sqliteDeleteIndex() when the Index structure itself is cleaned
    ** up.
    */
    int n;
    Table *pTab = pIdx->pTable;
    pIdx->zColAff = (char *)sqlite3DbMallocRaw(0, pIdx->nColumn+1);
    if( !pIdx->zColAff ){
      sqlite3OomFault(db);
      return 0;
    }
    for(n=0; n<pIdx->nColumn; n++){
      i16 x = pIdx->aiColumn[n];
      if( x>=0 ){
        pIdx->zColAff[n] = pTab->aCol[x].affinity;
      }else if( x==XN_ROWID ){
        pIdx->zColAff[n] = SQLITE_AFF_INTEGER;
      }else{
        char aff;
        assert( x==XN_EXPR );
        assert( pIdx->aColExpr!=0 );
        aff = sqlite3ExprAffinity(pIdx->aColExpr->a[n].pExpr);
        if( aff==0 ) aff = SQLITE_AFF_BLOB;
        pIdx->zColAff[n] = aff;
      }
    }
    pIdx->zColAff[n] = 0;
  }
 
  return pIdx->zColAff;
}